

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QTzType>::QList(QList<QTzType> *this,qsizetype size)

{
  QArrayDataPointer<QTzType> *in_RSI;
  QArrayDataPointer<QTzType> *in_RDI;
  QArrayDataPointer<QTzType> *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  AllocationOption in_stack_ffffffffffffffec;
  
  QArrayDataPointer<QTzType>::QArrayDataPointer
            (unaff_retaddr,(qsizetype)in_RDI,(qsizetype)in_RSI,in_stack_ffffffffffffffec);
  if (in_RSI != (QArrayDataPointer<QTzType> *)0x0) {
    QArrayDataPointer<QTzType>::operator->(in_RDI);
    QArrayDataPointer<QTzType>::appendInitialize
              (in_RSI,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  }
  return;
}

Assistant:

explicit QList(qsizetype size)
        : d(size)
    {
        if (size)
            d->appendInitialize(size);
    }